

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int AF_A_JumpIfInTargetLOS(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  bool bVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  bool local_de;
  bool local_db;
  FState *state_6;
  FState *state_5;
  FState *state_4;
  undefined1 local_b8 [16];
  DAngle an;
  FState *state_3;
  bool doCheckSight;
  FState *state_2;
  double distance;
  FState *state_1;
  FState *state;
  AActor *local_70;
  AActor *target;
  double dist_close;
  double dist_max;
  int flags;
  DAngle fov;
  FState *jump;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b5,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b5,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  local_db = true;
  if (this != (AActor *)0x0) {
    local_db = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_db == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b5,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b6,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, param[1].field_0.field_1.atag != 7)) {
    bVar3 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar3) {
    fov.Degrees = (double)param[1].field_0.field_1.a;
    TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffb0);
    if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb0,0.0);
    }
    else {
      if (param[2].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b7,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb0,param[2].field_0.f);
    }
    if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
      dist_max._4_4_ = 0;
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b8,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      dist_max._4_4_ = param[3].field_0.i;
    }
    if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
      dist_close = 0.0;
    }
    else {
      if (param[4].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b9,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      dist_close = param[4].field_0.f;
    }
    if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
      target = (AActor *)0x0;
    }
    else {
      if (param[5].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11ba,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      target = (AActor *)param[5].field_0.field_1.a;
    }
    if ((dist_max._4_4_ & 0x40) == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)((long)&state + 4),
                 (int)this + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&state + 4));
      local_de = uVar2 == 0 || (dist_max._4_4_ & 1) == 0;
      if (local_de) {
        local_70 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
      }
      else {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  ((TFlags<ActorFlag2,_unsigned_int> *)&state,
                   (int)this + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&state);
        if (uVar2 == 0) {
          local_70 = (AActor *)0x0;
        }
        else {
          local_70 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->tracer);
        }
      }
    }
    else {
      local_70 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->master);
    }
    if (local_70 == (AActor *)0x0) {
      if (numret < 1) {
        stack_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11d0,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,(void *)0x0,7);
        stack_local._4_4_ = 1;
      }
    }
    else if (((dist_max._4_4_ & 0x20) == 0) || (0 < local_70->health)) {
      dVar4 = AActor::Distance3D(this,local_70,false);
      if (((dist_close == 0.0) && (!NAN(dist_close))) || (dVar4 <= dist_close)) {
        bVar3 = (dist_max._4_4_ & 2) == 0;
        if ((((double)target != 0.0) || (NAN((double)target))) && (dVar4 < (double)target)) {
          if ((dist_max._4_4_ & 0x10) != 0) {
            an.Degrees = 0.0;
            if (numret < 1) {
              return 0;
            }
            if (ret != (VMReturn *)0x0) {
              VMReturn::SetPointer(ret,(void *)0x0,7);
              return 1;
            }
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11e5,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          if ((dist_max._4_4_ & 4) != 0) {
            TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb0,0.0);
          }
          bVar3 = (dist_max._4_4_ & 8) == 0 && bVar3;
        }
        bVar1 = TAngle<double>::operator>((TAngle<double> *)&stack0xffffffffffffffb0,0.0);
        if ((bVar1) &&
           (bVar1 = TAngle<double>::operator<((TAngle<double> *)&stack0xffffffffffffffb0,360.0),
           bVar1)) {
          AActor::AngleTo((AActor *)local_b8,local_70,SUB81(this,0));
          absangle<double>((TAngle<double> *)(local_b8 + 8),(TAngle<double> *)local_b8);
          TAngle<double>::operator/((TAngle<double> *)&state_4,2.0);
          bVar1 = TAngle<double>::operator>
                            ((TAngle<double> *)(local_b8 + 8),(TAngle<double> *)&state_4);
          if (bVar1) {
            if (numret < 1) {
              return 0;
            }
            if (ret != (VMReturn *)0x0) {
              VMReturn::SetPointer(ret,(void *)0x0,7);
              return 1;
            }
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11f4,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
        }
        if ((!bVar3) || (bVar3 = P_CheckSight(local_70,this,1), bVar3)) {
          if (numret < 1) {
            stack_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x11fb,
                            "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetPointer(ret,(void *)fov.Degrees,7);
            stack_local._4_4_ = 1;
          }
        }
        else if (numret < 1) {
          stack_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11f9,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetPointer(ret,(void *)0x0,7);
          stack_local._4_4_ = 1;
        }
      }
      else if (numret < 1) {
        stack_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11dc,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,(void *)0x0,7);
        stack_local._4_4_ = 1;
      }
    }
    else if (numret < 1) {
      stack_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11d5,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      VMReturn::SetPointer(ret,(void *)0x0,7);
      stack_local._4_4_ = 1;
    }
    return stack_local._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x11b6,
                "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STATE		(jump);
	PARAM_ANGLE_OPT	(fov)			{ fov = 0.; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_FLOAT_OPT	(dist_max)		{ dist_max = 0; }
	PARAM_FLOAT_OPT	(dist_close)	{ dist_close = 0; }

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_STATE(NULL);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_STATE(NULL);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_STATE(NULL);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_STATE(NULL);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_STATE(NULL); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_STATE(NULL);
	}
	ACTION_RETURN_STATE(jump);
}